

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise1D::forward
          (DeconvolutionDepthWise1D *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint kernel_w;
  uint uVar1;
  int iVar2;
  int iVar3;
  Mat *bottom_blob;
  Mat *top_blob;
  int *piVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int _h;
  int iVar9;
  Allocator **ppAVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  int i;
  ulong uVar22;
  int k;
  ulong uVar23;
  ulong uVar24;
  undefined4 in_stack_fffffffffffffe38;
  Mat local_198;
  Mat *local_148;
  Mat *local_140;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_138;
  void *local_130;
  ulong local_128;
  void *local_120;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  top_blob = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  iVar13 = bottom_blob->h;
  kernel_w = bottom_blob[1].w;
  lVar12 = (long)(int)kernel_w;
  _h = this->group * bottom_blob[1].h;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_138 = bottom_blobs;
  flatten(bottom_blob + 1,&local_78,opt);
  iVar9 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_004ed556;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,(int)(kernel_w * iVar13 * _h) / this->group,4,opt->workspace_allocator);
  iVar9 = -100;
  local_120 = local_c8.data;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    ppAVar10 = &opt->workspace_allocator;
    uVar1 = this->group;
    uVar11 = _h / (int)uVar1;
    uVar21 = (long)iVar13 / (long)(int)uVar1;
    iVar13 = 0;
    uVar18 = 0;
    if (0 < (int)kernel_w) {
      uVar18 = (ulong)kernel_w;
    }
    local_130 = local_78.data;
    iVar9 = (int)uVar21;
    uVar20 = 0;
    if (0 < iVar9) {
      uVar20 = uVar21 & 0xffffffff;
    }
    uVar21 = 0;
    if (0 < (int)uVar11) {
      uVar21 = (ulong)uVar11;
    }
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    local_128 = (ulong)uVar1;
    for (uVar24 = 0; uVar24 != local_128; uVar24 = uVar24 + 1) {
      pvVar19 = (void *)((long)local_c8.data + (long)iVar13 * 4);
      pvVar16 = (void *)((long)local_78.data + (long)iVar13 * 4);
      for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
        pvVar14 = pvVar19;
        pvVar15 = pvVar16;
        for (uVar17 = 0; uVar17 != uVar20; uVar17 = uVar17 + 1) {
          for (uVar23 = 0; uVar18 != uVar23; uVar23 = uVar23 + 1) {
            *(undefined4 *)((long)pvVar14 + uVar23 * 4) =
                 *(undefined4 *)((long)pvVar15 + uVar23 * 4);
          }
          pvVar14 = (void *)((long)pvVar14 + lVar12 * 4);
          pvVar15 = (void *)((long)pvVar15 + (int)uVar11 * lVar12 * 4);
        }
        pvVar19 = (void *)((long)pvVar19 + iVar9 * lVar12 * 4);
        pvVar16 = (void *)((long)pvVar16 + lVar12 * 4);
      }
      iVar13 = iVar13 + iVar9 * kernel_w * uVar11;
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118._20_8_ = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    local_148 = bottom_blob;
    local_140 = top_blob;
    if (this->bias_term == 0) {
LAB_004ed2fa:
      iVar13 = this->dilation_w;
      iVar9 = bottom_blob->w;
      iVar2 = this->stride_w;
      iVar3 = this->output_pad_right;
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      if ((this->pad_left < 1) && ((this->pad_right < 1 && (this->output_w < 1)))) {
        if (&local_198 != top_blob) {
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          local_198.data = top_blob->data;
          local_198.refcount._0_4_ = SUB84(top_blob->refcount,0);
          local_198.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
          local_198.elemsize._0_4_ = (undefined4)top_blob->elemsize;
          local_198.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
          local_198.elempack = top_blob->elempack;
          local_198.allocator = top_blob->allocator;
          uVar5 = top_blob->dims;
          uVar6 = top_blob->w;
          uVar7 = top_blob->h;
          uVar8 = top_blob->d;
          local_198.c = top_blob->c;
          local_198.cstep = top_blob->cstep;
          local_198.dims = uVar5;
          local_198.w = uVar6;
          local_198.h = uVar7;
          local_198.d = uVar8;
        }
        ppAVar10 = &opt->blob_allocator;
      }
      Mat::create(&local_198,(kernel_w - 1) * iVar13 + (iVar9 + -1) * iVar2 + iVar3 + 1,_h,4,
                  *ppAVar10);
      if ((local_198.data == (void *)0x0) || ((long)local_198.c * local_198.cstep == 0)) {
LAB_004ed4b7:
        iVar9 = -100;
      }
      else {
        deconvolutiondepthwise1d
                  (bottom_blob,&local_198,&local_c8,&local_118,kernel_w,this->stride_w,
                   this->dilation_w,this->group,this->activation_type,&this->activation_params,
                   (Option *)CONCAT44(_h,in_stack_fffffffffffffe38));
        cut_padding(this,&local_198,top_blob,opt);
        if ((top_blob->data == (void *)0x0) || (iVar9 = 0, (long)top_blob->c * top_blob->cstep == 0)
           ) goto LAB_004ed4b7;
      }
      piVar4 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            free(local_198.data);
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      flatten((local_138->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_118,opt);
      iVar9 = -100;
      if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0))
      goto LAB_004ed2fa;
    }
    piVar4 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_004ed556:
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar9;
}

Assistant:

int DeconvolutionDepthWise1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.h;
    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.h * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kw to group-outch/group-inch/group-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise1d(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}